

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

ALLEGRO_FILE * al_fopen_fd(int fd,char *mode)

{
  undefined8 *puVar1;
  FILE *pFVar2;
  char *in_RSI;
  int in_EDI;
  FILE *fp;
  USERDATA *userdata;
  ALLEGRO_FILE *f;
  ALLEGRO_FILE *in_stack_ffffffffffffffc8;
  ALLEGRO_FILE_INTERFACE *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  ALLEGRO_FILE *local_8;
  
  puVar1 = (undefined8 *)
           al_malloc_with_context
                     (in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                      (char *)in_stack_ffffffffffffffc8,(char *)0x17683a);
  if (puVar1 == (undefined8 *)0x0) {
    local_8 = (ALLEGRO_FILE *)0x0;
  }
  else {
    *puVar1 = 0;
    *(undefined4 *)(puVar1 + 1) = 0;
    local_8 = al_create_file_handle(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (local_8 == (ALLEGRO_FILE *)0x0) {
      al_free_with_context
                ((void *)0x0,(int)((ulong)puVar1 >> 0x20),(char *)in_stack_ffffffffffffffd0,
                 (char *)in_stack_ffffffffffffffc8);
      local_8 = (ALLEGRO_FILE *)0x0;
    }
    else {
      pFVar2 = fdopen(in_EDI,in_RSI);
      if (pFVar2 == (FILE *)0x0) {
        __errno_location();
        al_set_errno((int)((ulong)pFVar2 >> 0x20));
        al_fclose(in_stack_ffffffffffffffc8);
        local_8 = (ALLEGRO_FILE *)0x0;
      }
      else {
        *puVar1 = pFVar2;
      }
    }
  }
  return local_8;
}

Assistant:

ALLEGRO_FILE *al_fopen_fd(int fd, const char *mode)
{
   ALLEGRO_FILE *f;
   USERDATA *userdata;
   FILE *fp;

   userdata = al_malloc(sizeof(USERDATA));
   if (!userdata)
      return NULL;

   /* The fd should remain open if this function fails in any way,
    * so delay the fdopen() call to last.
    */
   userdata->fp = NULL;
   userdata->errnum = 0;

   f = al_create_file_handle(&_al_file_interface_stdio, userdata);
   if (!f) {
      al_free(userdata);
      return NULL;
   }

   fp = fdopen(fd, mode);
   if (!fp) {
      al_set_errno(errno);
      al_fclose(f);
      return NULL;
   }

   userdata->fp = fp;
   return f;
}